

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O0

void __thiscall
Clasp::SolveAlgorithm::start
          (SolveAlgorithm *this,SharedContext *ctx,LitVec *assume,ModelHandler *onModel)

{
  bool bVar1;
  SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
  *this_00;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *ppVar2;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RDI;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *unaff_retaddr;
  SharedContext *in_stack_ffffffffffffffd0;
  SolveAlgorithm *in_stack_ffffffffffffffd8;
  
  ppVar2 = in_RDI;
  bVar1 = attach(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(ModelHandler *)in_RDI);
  if (bVar1) {
    this_00 = (SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
               *)operator_new(0x10);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
              (unaff_retaddr,ppVar2);
    SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
    ::operator=(this_00,in_RSI);
    ppVar2 = SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
             ::operator*((SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
                          *)0x1e319c);
    (**(_func_int **)((in_RDI->ebo_).buf + 0xe))(in_RDI,in_RSI,ppVar2);
  }
  return;
}

Assistant:

void SolveAlgorithm::start(SharedContext& ctx, const LitVec& assume, ModelHandler* onModel) {
	if (attach(ctx, onModel)) {
		doStart(ctx, *(path_ = new LitVec(assume)));
	}
}